

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRepresentationContext::~IfcRepresentationContext
          (IfcRepresentationContext *this)

{
  ~IfcRepresentationContext
            ((IfcRepresentationContext *)
             ((long)&(this->
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>).
                     _vptr_ObjectHelper +
             (long)(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>
                   )._vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcRepresentationContext() : Object("IfcRepresentationContext") {}